

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_nn_predict_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f3d658::NnPredictTest_DISABLED_Speed_Test::TestBody
          (NnPredictTest_DISABLED_Speed_Test *this)

{
  NN_CONFIG *in_stack_00000008;
  NnPredictTest *in_stack_00000010;
  
  NnPredictTest::RunNnPredictSpeedTest_all(in_stack_00000010,in_stack_00000008,this._4_4_,(int)this)
  ;
  return;
}

Assistant:

TEST_P(NnPredictTest, DISABLED_Speed) {
  RunNnPredictSpeedTest_all(kShapes, sizeof(kShapes) / sizeof(kShapes[0]),
                            10000000);
}